

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

void BinarySink_put_wpoint(BinarySink *bs,WeierstrassPoint *point,ec_curve *curve,_Bool bare)

{
  BinarySink *pBVar1;
  uint8_t uVar2;
  uint uVar3;
  undefined3 in_register_00000009;
  BinarySink *pBVar4;
  size_t sVar5;
  mp_int *y;
  mp_int *x;
  mp_int *local_48;
  mp_int *local_40;
  strbuf *local_38;
  
  pBVar4 = bs;
  if (CONCAT31(in_register_00000009,bare) == 0) {
    local_38 = strbuf_new();
    pBVar4 = local_38->binarysink_;
  }
  uVar3 = ecc_weierstrass_is_identity(point);
  if (uVar3 == 0) {
    ecc_weierstrass_get_affine(point,&local_40,&local_48);
    BinarySink_put_byte(pBVar4->binarysink_,'\x04');
    sVar5 = curve->fieldBytes;
    while (sVar5 != 0) {
      sVar5 = sVar5 - 1;
      pBVar1 = pBVar4->binarysink_;
      uVar2 = mp_get_byte(local_40,sVar5);
      BinarySink_put_byte(pBVar1,uVar2);
    }
    sVar5 = curve->fieldBytes;
    while (sVar5 != 0) {
      sVar5 = sVar5 - 1;
      pBVar1 = pBVar4->binarysink_;
      uVar2 = mp_get_byte(local_48,sVar5);
      BinarySink_put_byte(pBVar1,uVar2);
    }
    mp_free(local_40);
    mp_free(local_48);
  }
  else {
    BinarySink_put_byte(pBVar4->binarysink_,'\0');
  }
  if (!bare) {
    BinarySink_put_stringsb(bs->binarysink_,local_38);
  }
  return;
}

Assistant:

static void BinarySink_put_wpoint(
    BinarySink *bs, WeierstrassPoint *point, const struct ec_curve *curve,
    bool bare)
{
    strbuf *sb;
    BinarySink *bs_inner;

    if (!bare) {
        /*
         * Encapsulate the raw data inside an outermost string layer.
         */
        sb = strbuf_new();
        bs_inner = BinarySink_UPCAST(sb);
    } else {
        /*
         * Just write the data directly to the output.
         */
        bs_inner = bs;
    }

    if (ecc_weierstrass_is_identity(point)) {
        put_byte(bs_inner, 0);
    } else {
        mp_int *x, *y;
        ecc_weierstrass_get_affine(point, &x, &y);

        /*
         * For ECDSA, we only ever output uncompressed points.
         */
        put_byte(bs_inner, 0x04);
        for (size_t i = curve->fieldBytes; i--;)
            put_byte(bs_inner, mp_get_byte(x, i));
        for (size_t i = curve->fieldBytes; i--;)
            put_byte(bs_inner, mp_get_byte(y, i));

        mp_free(x);
        mp_free(y);
    }

    if (!bare)
        put_stringsb(bs, sb);
}